

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

int __thiscall
ON_PolylineCurve::GetNurbForm
          (ON_PolylineCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  bool bVar1;
  uint cv_count;
  int dim;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ON_Interval local_40;
  
  cv_count = ON_Polyline::PointCount(&this->m_pline);
  if ((int)cv_count < 2) {
    ON_NurbsCurve::Destroy(nurb);
    uVar2 = 0;
  }
  else {
    dim = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    uVar2 = 0;
    bVar1 = ON_NurbsCurve::Create(nurb,dim,false,2,cv_count);
    if (bVar1) {
      lVar3 = 0;
      for (uVar4 = 0; cv_count != uVar4; uVar4 = uVar4 + 1) {
        ON_NurbsCurve::SetKnot(nurb,(int)uVar4,(this->m_t).m_a[uVar4]);
        ON_NurbsCurve::SetCV
                  (nurb,(int)uVar4,
                   (ON_3dPoint *)
                   ((long)&((this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.
                           m_a)->x + lVar3));
        lVar3 = lVar3 + 0x18;
      }
      if (subdomain != (ON_Interval *)0x0) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
        bVar1 = ON_Interval::operator!=(subdomain,&local_40);
        if (bVar1) {
          (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])
                    (nurb,subdomain);
        }
      }
      uVar2 = (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(nurb,0)
      ;
      uVar2 = uVar2 & 0xff;
    }
  }
  return uVar2;
}

Assistant:

int ON_PolylineCurve::GetNurbForm( 
                                  ON_NurbsCurve& nurb, 
                                  double tol,
                                  const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                                  ) const
{
  int rc = 0;
  const int count = PointCount();
  if ( count < 2 )
    nurb.Destroy();
  else  if ( nurb.Create( Dimension(), false, 2, count) ) {
    int i;
    for ( i = 0; i < count; i++ ) {
      nurb.SetKnot( i, m_t[i] );
      nurb.SetCV( i, m_pline[i] );
    }
    if ( subdomain && *subdomain != Domain() )
      nurb.Trim(*subdomain);
    if ( nurb.IsValid() )
      rc = 1;
  }
  return rc;
}